

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void unsetJoinExpr(Expr *p,int iTable)

{
  ExprList *pEVar1;
  long lVar2;
  long lVar3;
  
  if (p != (Expr *)0x0) {
    do {
      if (((p->flags & 1) != 0) && ((iTable < 0 || (p->iRightJoinTable == iTable)))) {
        p->flags = p->flags & 0xfffffffe;
      }
      if (((p->op == 0x9d) && ((p->x).pList != (ExprList *)0x0)) &&
         (pEVar1 = (p->x).pList, 0 < pEVar1->nExpr)) {
        lVar3 = 8;
        lVar2 = 0;
        do {
          unsetJoinExpr(*(Expr **)((long)pEVar1->a + lVar3 + -8),iTable);
          lVar2 = lVar2 + 1;
          pEVar1 = (p->x).pList;
          lVar3 = lVar3 + 0x20;
        } while (lVar2 < pEVar1->nExpr);
      }
      unsetJoinExpr(p->pLeft,iTable);
      p = p->pRight;
    } while (p != (Expr *)0x0);
  }
  return;
}

Assistant:

static void unsetJoinExpr(Expr *p, int iTable){
  while( p ){
    if( ExprHasProperty(p, EP_FromJoin)
     && (iTable<0 || p->iRightJoinTable==iTable) ){
      ExprClearProperty(p, EP_FromJoin);
    }
    if( p->op==TK_FUNCTION && p->x.pList ){
      int i;
      for(i=0; i<p->x.pList->nExpr; i++){
        unsetJoinExpr(p->x.pList->a[i].pExpr, iTable);
      }
    }
    unsetJoinExpr(p->pLeft, iTable);
    p = p->pRight;
  } 
}